

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

void ZSTD_CCtxParams_init_internal
               (ZSTD_CCtx_params *cctxParams,ZSTD_parameters *params,int compressionLevel)

{
  ZSTD_paramSwitch_e ZVar1;
  ZSTD_compressionParameters cParams;
  int iVar2;
  size_t sVar3;
  int in_EDX;
  ZSTD_compressionParameters *in_RSI;
  void *in_RDI;
  ZSTD_compressionParameters *cParams_00;
  undefined1 in_stack_ffffffffffffffc4 [12];
  
  cParams_00 = *(ZSTD_compressionParameters **)in_RSI;
  ZVar1 = in_RSI->hashLog;
  cParams._4_12_ = in_stack_ffffffffffffffc4;
  cParams.windowLog = in_RSI->strategy;
  cParams._16_8_ = cParams_00;
  cParams.strategy = ZVar1;
  sVar3 = ZSTD_checkCParams(cParams);
  if (sVar3 == 0) {
    memset(in_RDI,0,0xd0);
    *(undefined8 *)((long)in_RDI + 4) = *(undefined8 *)in_RSI;
    *(undefined8 *)((long)in_RDI + 0xc) = *(undefined8 *)&in_RSI->hashLog;
    *(undefined8 *)((long)in_RDI + 0x14) = *(undefined8 *)&in_RSI->minMatch;
    *(ZSTD_strategy *)((long)in_RDI + 0x1c) = in_RSI->strategy;
    *(undefined8 *)((long)in_RDI + 0x20) = *(undefined8 *)(in_RSI + 1);
    *(uint *)((long)in_RDI + 0x28) = in_RSI[1].hashLog;
    *(int *)((long)in_RDI + 0x2c) = in_EDX;
    ZVar1 = ZSTD_resolveRowMatchFinderMode(ZVar1,cParams_00);
    *(ZSTD_paramSwitch_e *)((long)in_RDI + 0x90) = ZVar1;
    ZVar1 = ZSTD_resolveBlockSplitterMode(*(ZSTD_paramSwitch_e *)((long)in_RDI + 0x8c),in_RSI);
    *(ZSTD_paramSwitch_e *)((long)in_RDI + 0x8c) = ZVar1;
    ZVar1 = ZSTD_resolveEnableLdm(*(ZSTD_paramSwitch_e *)((long)in_RDI + 0x60),in_RSI);
    *(ZSTD_paramSwitch_e *)((long)in_RDI + 0x60) = ZVar1;
    iVar2 = ZSTD_resolveExternalSequenceValidation(*(int *)((long)in_RDI + 0x88));
    *(int *)((long)in_RDI + 0x88) = iVar2;
    sVar3 = ZSTD_resolveMaxBlockSize(*(size_t *)((long)in_RDI + 0xc0));
    *(size_t *)((long)in_RDI + 0xc0) = sVar3;
    ZVar1 = ZSTD_resolveExternalRepcodeSearch(*(ZSTD_paramSwitch_e *)((long)in_RDI + 200),in_EDX);
    *(ZSTD_paramSwitch_e *)((long)in_RDI + 200) = ZVar1;
    return;
  }
  __assert_fail("!ZSTD_checkCParams(params->cParams)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x5238,
                "void ZSTD_CCtxParams_init_internal(ZSTD_CCtx_params *, const ZSTD_parameters *, int)"
               );
}

Assistant:

static void
ZSTD_CCtxParams_init_internal(ZSTD_CCtx_params* cctxParams,
                        const ZSTD_parameters* params,
                              int compressionLevel)
{
    assert(!ZSTD_checkCParams(params->cParams));
    ZSTD_memset(cctxParams, 0, sizeof(*cctxParams));
    cctxParams->cParams = params->cParams;
    cctxParams->fParams = params->fParams;
    /* Should not matter, as all cParams are presumed properly defined.
     * But, set it for tracing anyway.
     */
    cctxParams->compressionLevel = compressionLevel;
    cctxParams->useRowMatchFinder = ZSTD_resolveRowMatchFinderMode(cctxParams->useRowMatchFinder, &params->cParams);
    cctxParams->useBlockSplitter = ZSTD_resolveBlockSplitterMode(cctxParams->useBlockSplitter, &params->cParams);
    cctxParams->ldmParams.enableLdm = ZSTD_resolveEnableLdm(cctxParams->ldmParams.enableLdm, &params->cParams);
    cctxParams->validateSequences = ZSTD_resolveExternalSequenceValidation(cctxParams->validateSequences);
    cctxParams->maxBlockSize = ZSTD_resolveMaxBlockSize(cctxParams->maxBlockSize);
    cctxParams->searchForExternalRepcodes = ZSTD_resolveExternalRepcodeSearch(cctxParams->searchForExternalRepcodes, compressionLevel);
    DEBUGLOG(4, "ZSTD_CCtxParams_init_internal: useRowMatchFinder=%d, useBlockSplitter=%d ldm=%d",
                cctxParams->useRowMatchFinder, cctxParams->useBlockSplitter, cctxParams->ldmParams.enableLdm);
}